

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O3

void xxHash64_test(void *key,int len,uint32_t seed,void *out)

{
  uint *puVar1;
  byte *pbVar2;
  uint *puVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar12 = (ulong)seed;
  if ((uint)len < 0x20) {
    lVar5 = uVar12 + 0x27d4eb2f165667c5;
  }
  else {
    puVar3 = (uint *)((long)key + (long)len + -0x20);
    uVar9 = uVar12 + 0xc2b2ae3d27d4eb4f;
    uVar11 = uVar12 + 0x60ea27eeadc0b5d6;
    uVar6 = uVar12 + 0x61c8864e7a143579;
    do {
      uVar11 = *key * -0x3d4d51c2d82b14b1 + uVar11;
      uVar9 = *(long *)((long)key + 8) * -0x3d4d51c2d82b14b1 + uVar9;
      uVar12 = *(long *)((long)key + 0x10) * -0x3d4d51c2d82b14b1 + uVar12;
      uVar7 = uVar11 >> 0x21 | uVar11 * 0x80000000;
      puVar1 = (uint *)((long)key + 0x18);
      uVar10 = uVar9 >> 0x21 | uVar9 * 0x80000000;
      uVar13 = uVar12 >> 0x21 | uVar12 * 0x80000000;
      key = (void *)((long)key + 0x20);
      uVar11 = uVar7 * -0x61c8864e7a143579;
      uVar9 = uVar10 * -0x61c8864e7a143579;
      uVar12 = uVar13 * -0x61c8864e7a143579;
      uVar6 = *(long *)puVar1 * -0x3d4d51c2d82b14b1 + uVar6;
      uVar8 = uVar6 >> 0x21 | uVar6 * 0x80000000;
      uVar6 = uVar8 * -0x61c8864e7a143579;
    } while (key <= puVar3);
    lVar5 = ((uVar8 * -0x210ca4fef0869357 >> 0x21 | uVar8 * -0x784349ab80000000) *
             -0x61c8864e7a143579 ^
            ((uVar13 * -0x210ca4fef0869357 >> 0x21 | uVar13 * -0x784349ab80000000) *
             -0x61c8864e7a143579 ^
            ((uVar10 * -0x210ca4fef0869357 >> 0x21 | uVar10 * -0x784349ab80000000) *
             -0x61c8864e7a143579 ^
            ((uVar7 * -0x210ca4fef0869357 >> 0x21 | uVar7 * -0x784349ab80000000) *
             -0x61c8864e7a143579 ^
            (uVar6 >> 0x2e | uVar8 * -0x1939e850d5e40000) +
            (uVar12 >> 0x34 | uVar13 * 0x779b185ebca87000) +
            (uVar9 >> 0x39 | uVar10 * 0x1bbcd8c2f5e54380) +
            (uVar11 >> 0x3f | uVar7 * 0x3c6ef3630bd7950e)) * -0x61c8864e7a143579 +
            0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 +
            0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
  }
  uVar12 = lVar5 + len;
  for (uVar9 = (ulong)(len & 0x1f); 7 < uVar9; uVar9 = uVar9 - 8) {
    lVar5 = *key;
    key = (void *)((long)key + 8);
    uVar12 = ((ulong)(lVar5 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar5 * -0x6c158a5880000000) *
             -0x61c8864e7a143579 ^ uVar12;
    uVar12 = (uVar12 >> 0x25 | uVar12 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  }
  if (3 < uVar9) {
    uVar4 = *key;
    key = (void *)((long)key + 4);
    uVar9 = uVar9 - 4;
    uVar12 = (ulong)uVar4 * -0x61c8864e7a143579 ^ uVar12;
    uVar12 = (uVar12 >> 0x29 | uVar12 << 0x17) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
  }
  if (uVar9 != 0) {
    uVar6 = 0;
    do {
      pbVar2 = (byte *)((long)key + uVar6);
      uVar6 = uVar6 + 1;
      uVar12 = (ulong)*pbVar2 * 0x27d4eb2f165667c5 ^ uVar12;
      uVar12 = (uVar12 >> 0x35 | uVar12 << 0xb) * -0x61c8864e7a143579;
    } while (uVar9 != uVar6);
  }
  uVar12 = (uVar12 >> 0x21 ^ uVar12) * -0x3d4d51c2d82b14b1;
  uVar12 = (uVar12 >> 0x1d ^ uVar12) * 0x165667b19e3779f9;
  *(ulong *)out = uVar12 >> 0x20 ^ uVar12;
  return;
}

Assistant:

inline void xxHash64_test( const void * key, int len, uint32_t seed, void * out ) {
  // objsize 630-7fc + c10-1213: 1999
  *(uint64_t*)out = (uint64_t) XXH64(key, (size_t) len, (unsigned long long) seed);
}